

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  ImGuiID id;
  long lVar6;
  bool bVar7;
  ImGuiWindow *this;
  float fVar8;
  ImVec2 IVar9;
  ImVec4 local_38;
  
  pIVar4 = GImGui;
  if ((flags & 0x10U) == 0) {
    this = GImGui->CurrentWindow;
    id = (this->DC).LastItemId;
    if (id == 0) {
      if ((GImGui->IO).MouseDown[0] != false) {
        if ((flags & 8U) == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                        ,0x3361,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
        }
        bVar7 = (bool)((byte)(this->DC).LastItemStatusFlags & 1);
        if (bVar7 == false) {
          if ((GImGui->ActiveId == 0) || (GImGui->ActiveIdWindow != this)) goto LAB_00199aa2;
          id = ImGuiWindow::GetIDFromRectangle(this,&(this->DC).LastItemRect);
          (this->DC).LastItemId = id;
        }
        else {
          id = ImGuiWindow::GetIDFromRectangle(this,&(this->DC).LastItemRect);
          (this->DC).LastItemId = id;
          pIVar3 = GImGui;
          GImGui->HoveredId = id;
          pIVar3->HoveredIdAllowOverlap = false;
          fVar8 = 0.0;
          if ((id != 0) && (pIVar3->HoveredIdPreviousFrame == id)) {
            fVar8 = pIVar3->HoveredIdTimer + (pIVar3->IO).DeltaTime;
          }
          pIVar3->HoveredIdTimer = fVar8;
          if ((pIVar4->IO).MouseClicked[0] == true) {
            SetActiveID(id,this);
            FocusWindow(this);
          }
        }
        if (pIVar4->ActiveId == id) {
          pIVar4->ActiveIdAllowOverlap = bVar7;
          goto LAB_00199a70;
        }
      }
    }
    else if ((GImGui->ActiveId == id) && ((GImGui->IO).MouseDown[0] != false)) {
LAB_00199a70:
      lVar6 = (long)(this->IDStack).Size;
      if (lVar6 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4ca,"value_type &ImVector<unsigned int>::back() [T = unsigned int]");
      }
      if (((GImGui->IO).MouseDown[0] != false) &&
         (fVar8 = (GImGui->IO).MouseDragThreshold,
         fVar8 * fVar8 <= (GImGui->IO).MouseDragMaxDistanceSqr[0])) {
        uVar5 = (this->IDStack).Data[lVar6 + -1];
        goto LAB_0019986a;
      }
    }
LAB_00199aa2:
    bVar7 = false;
  }
  else {
    this = (ImGuiWindow *)0x0;
    id = ImHash("#SourceExtern",0,0);
    uVar5 = 0;
LAB_0019986a:
    pIVar3 = GImGui;
    if (pIVar4->DragDropActive == false) {
      if (id == 0) {
        __assert_fail("source_id != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0x3387,"bool ImGui::BeginDragDropSource(ImGuiDragDropFlags)");
      }
      GImGui->DragDropActive = false;
      (pIVar3->DragDropPayload).DataType[0] = '\0';
      (pIVar3->DragDropPayload).DataType[1] = '\0';
      (pIVar3->DragDropPayload).DataType[2] = '\0';
      (pIVar3->DragDropPayload).DataType[3] = '\0';
      (pIVar3->DragDropPayload).DataType[4] = '\0';
      (pIVar3->DragDropPayload).DataType[5] = '\0';
      (pIVar3->DragDropPayload).DataType[6] = '\0';
      (pIVar3->DragDropPayload).DataType[7] = '\0';
      (pIVar3->DragDropPayload).DataType[8] = '\0';
      (pIVar3->DragDropPayload).DataType[9] = '\0';
      (pIVar3->DragDropPayload).DataType[10] = '\0';
      (pIVar3->DragDropPayload).DataType[0xb] = '\0';
      (pIVar3->DragDropPayload).DataType[0xc] = '\0';
      (pIVar3->DragDropPayload).DataType[0xd] = '\0';
      (pIVar3->DragDropPayload).DataType[0xe] = '\0';
      (pIVar3->DragDropPayload).DataType[0xf] = '\0';
      (pIVar3->DragDropPayload).DataType[0x10] = '\0';
      (pIVar3->DragDropPayload).DataType[0x11] = '\0';
      (pIVar3->DragDropPayload).DataType[0x12] = '\0';
      (pIVar3->DragDropPayload).DataType[0x13] = '\0';
      (pIVar3->DragDropPayload).DataType[0x14] = '\0';
      (pIVar3->DragDropPayload).DataType[0x15] = '\0';
      (pIVar3->DragDropPayload).DataType[0x16] = '\0';
      (pIVar3->DragDropPayload).DataType[0x17] = '\0';
      (pIVar3->DragDropPayload).DataType[0x18] = '\0';
      (pIVar3->DragDropPayload).DataType[0x19] = '\0';
      (pIVar3->DragDropPayload).DataType[0x1a] = '\0';
      (pIVar3->DragDropPayload).DataType[0x1b] = '\0';
      (pIVar3->DragDropPayload).DataType[0x1c] = '\0';
      (pIVar3->DragDropPayload).DataType[0x1d] = '\0';
      (pIVar3->DragDropPayload).DataType[0x1e] = '\0';
      (pIVar3->DragDropPayload).DataType[0x1f] = '\0';
      (pIVar3->DragDropPayload).DataType[0x20] = '\0';
      (pIVar3->DragDropPayload).Data = (void *)0x0;
      (pIVar3->DragDropPayload).DataSize = 0;
      (pIVar3->DragDropPayload).SourceId = 0;
      (pIVar3->DragDropPayload).SourceParentId = 0;
      (pIVar3->DragDropPayload).DataFrameCount = -1;
      (pIVar3->DragDropPayload).Preview = false;
      (pIVar3->DragDropPayload).Delivery = false;
      pIVar3->DragDropAcceptIdPrev = 0;
      pIVar3->DragDropAcceptFrameCount = -1;
      pIVar3->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
      pIVar3->DragDropAcceptIdCurr = 0;
      (pIVar4->DragDropPayload).SourceId = id;
      (pIVar4->DragDropPayload).SourceParentId = uVar5;
      pIVar4->DragDropActive = true;
      pIVar4->DragDropSourceFlags = flags;
      pIVar4->DragDropMouseButton = 0;
    }
    pIVar3 = GImGui;
    if ((flags & 1U) == 0) {
      fVar8 = (pIVar4->Style).MouseCursorScale;
      IVar2 = (pIVar4->IO).MousePos;
      IVar9.x = IVar2.x + fVar8 * 16.0;
      IVar9.y = IVar2.y + fVar8 * 8.0;
      (GImGui->NextWindowData).PosVal = IVar9;
      (pIVar3->NextWindowData).PosPivotVal.x = 0.0;
      (pIVar3->NextWindowData).PosPivotVal.y = 0.0;
      (pIVar3->NextWindowData).PosCond = 1;
      local_38.w = (pIVar3->Style).Colors[4].w * 0.6;
      local_38.x = (pIVar3->Style).Colors[4].x;
      local_38.y = (pIVar3->Style).Colors[4].y;
      local_38.z = (pIVar3->Style).Colors[4].z;
      PushStyleColor(4,&local_38);
      BeginTooltip();
    }
    bVar7 = true;
    if ((flags & 0x12U) == 0) {
      pIVar1 = &(this->DC).LastItemStatusFlags;
      *(byte *)pIVar1 = (byte)*pIVar1 & 0xfe;
    }
  }
  return bVar7;
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    int mouse_button = 0;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = window->DC.LastItemId;
        if (source_id != 0 && g.ActiveId != source_id) // Early out for most common case
            return false;
        if (g.IO.MouseDown[mouse_button] == false)
            return false;

        if (source_id == 0)
        {
            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag, C) Swallow your programmer pride.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Magic fallback (=somehow reprehensible) to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            bool is_hovered = (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect) != 0;
            if (!is_hovered && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;
            source_id = window->DC.LastItemId = window->GetIDFromRectangle(window->DC.LastItemRect);
            if (is_hovered)
                SetHoveredID(source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);
    }
    else
    {
        window = NULL;
        source_id = ImHash("#SourceExtern", 0);
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // FIXME-DRAG
            //SetNextWindowPos(g.IO.MousePos - g.ActiveIdClickOffset - g.Style.WindowPadding);
            //PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * 0.60f); // This is better but e.g ColorButton with checkboard has issue with transparent colors :(

            // The default tooltip position is a little offset to give space to see the context menu (it's also clamped within the current viewport/monitor)
            // In the context of a dragging tooltip we try to reduce that offset and we enforce following the cursor.
            ImVec2 tooltip_pos = g.IO.MousePos + ImVec2(16 * g.Style.MouseCursorScale, 8 * g.Style.MouseCursorScale);
            SetNextWindowPos(tooltip_pos);
            PushStyleColor(ImGuiCol_PopupBg, GetStyleColorVec4(ImGuiCol_PopupBg) * ImVec4(1.0f, 1.0f, 1.0f, 0.6f));
            BeginTooltip();
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            window->DC.LastItemStatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}